

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O1

void __thiscall QEvdevTouchScreenData::reportPoints(QEvdevTouchScreenData *this)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  QDebug this_00;
  pointer pTVar8;
  undefined8 *puVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  double dVar13;
  double dVar14;
  Representation RVar15;
  Representation RVar17;
  double dVar16;
  int iVar18;
  int iVar19;
  QRect QVar20;
  QByteArrayView QVar21;
  double dStack_a0;
  double dStack_90;
  QDebug local_68;
  QTextStream *local_60;
  QDebug local_58;
  QString local_50;
  qreal local_38;
  
  local_38 = *(qreal *)(in_FS_OFFSET + 0x28);
  QVar20 = screenGeometry(this);
  RVar15 = QVar20.x1.m_i;
  RVar17 = QVar20.y1.m_i;
  iVar18 = -(uint)(RVar15.m_i + -1 == QVar20.x2.m_i.m_i);
  iVar19 = -(uint)(RVar17.m_i + -1 == QVar20.y2.m_i.m_i);
  auVar2._4_4_ = iVar18;
  auVar2._0_4_ = iVar18;
  auVar2._8_4_ = iVar19;
  auVar2._12_4_ = iVar19;
  iVar18 = movmskpd(RVar15.m_i,auVar2);
  if (iVar18 != 3) {
    uVar10 = (uint)(this->m_touchPoints).d.size;
    if (0 < (int)uVar10) {
      auVar3._8_4_ = SUB84((double)RVar17.m_i,0);
      auVar3._0_8_ = (double)RVar15.m_i;
      auVar3._12_4_ = (int)((ulong)(double)RVar17.m_i >> 0x20);
      iVar18 = QVar20.x2.m_i.m_i - RVar15.m_i;
      iVar19 = QVar20.y2.m_i.m_i - RVar17.m_i;
      dVar5 = (double)iVar18;
      dVar16 = (double)iVar19;
      auVar4._8_4_ = SUB84(dVar16,0);
      auVar4._0_8_ = dVar5;
      auVar4._12_4_ = (int)((ulong)dVar16 >> 0x20);
      dVar16 = (double)(iVar19 + iVar18 + 2) /
               (double)((this->hw_range_y_max + this->hw_range_x_max) -
                       (this->hw_range_y_min + this->hw_range_x_min));
      uVar11 = (ulong)(uVar10 & 0x7fffffff);
      lVar12 = 0;
      do {
        pTVar8 = QList<QWindowSystemInterface::TouchPoint>::data(&this->m_touchPoints);
        puVar9 = (undefined8 *)((long)(pTVar8->velocity).v + lVar12 + -0x34);
        dVar13 = *(double *)((long)(pTVar8->velocity).v + lVar12 + -0x24);
        if ((dVar13 != -1.0) || (NAN(dVar13))) {
          dVar13 = dVar13 * dVar16;
          dVar14 = *(double *)((long)(pTVar8->velocity).v + lVar12 + -0x1c) * dVar16;
          *puVar9 = 0;
          *(undefined8 *)((long)(pTVar8->velocity).v + lVar12 + -0x2c) = 0;
        }
        else {
          *puVar9 = 0;
          *(undefined8 *)((long)(pTVar8->velocity).v + lVar12 + -0x2c) = 0;
          dVar13 = 8.0;
          dVar14 = 8.0;
        }
        pdVar1 = (double *)((long)(pTVar8->velocity).v + lVar12 + -0x44);
        dVar6 = *pdVar1;
        dVar7 = pdVar1[1];
        dStack_a0 = auVar4._8_8_;
        dStack_90 = auVar3._8_8_;
        pdVar1 = (double *)((long)(pTVar8->velocity).v + lVar12 + -0x24);
        *pdVar1 = dVar13;
        pdVar1[1] = dVar14;
        pdVar1 = (double *)((long)(pTVar8->velocity).v + lVar12 + -0x34);
        *pdVar1 = dVar13 * -0.5 + dVar6 * dVar5 + (double)RVar15.m_i;
        pdVar1[1] = dVar14 * -0.5 + dVar7 * dStack_a0 + dStack_90;
        iVar18 = this->hw_pressure_min;
        if (iVar18 == 0 && this->hw_pressure_max == 0) {
          dVar13 = 1.0;
          if (*(char *)((long)(pTVar8->velocity).v + lVar12 + -4) == '\b') {
            dVar13 = 0.0;
          }
        }
        else {
          dVar13 = (*(double *)((long)(pTVar8->velocity).v + lVar12 + -0x14) - (double)iVar18) /
                   (double)(this->hw_pressure_max - iVar18);
        }
        *(double *)((long)(pTVar8->velocity).v + lVar12 + -0x14) = dVar13;
        qLcEvents();
        if ((((byte)qLcEvents::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
           && (qLcEvents(),
              ((byte)qLcEvents::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
           ) {
          QMessageLogger::debug();
          this_00.stream = local_68.stream;
          QVar21.m_data = &DAT_00000009;
          QVar21.m_size = (qsizetype)&local_50;
          QString::fromUtf8(QVar21);
          QTextStream::operator<<((QTextStream *)this_00.stream,&local_50);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_68.stream,' ');
          }
          local_60 = (QTextStream *)local_68.stream;
          *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
          operator<<((Stream *)&local_58,(TouchPoint *)&local_60);
          QDebug::~QDebug(&local_58);
          QDebug::~QDebug((QDebug *)&local_60);
          QDebug::~QDebug(&local_68);
        }
        lVar12 = lVar12 + 0x78;
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
    if (this->m_filtered == false) {
      QWindowSystemInterface::handleTouchEvent<QWindowSystemInterface::DefaultDelivery>
                (0,this->q->m_device,&this->m_touchPoints,0);
    }
    else {
      QMetaObject::activate
                (&this->q->super_QObject,&QEvdevTouchScreenHandler::staticMetaObject,0,(void **)0x0)
      ;
    }
  }
  if (*(qreal *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevTouchScreenData::reportPoints()
{
    QRect winRect = screenGeometry();
    if (winRect.isNull())
        return;

    const int hw_w = hw_range_x_max - hw_range_x_min;
    const int hw_h = hw_range_y_max - hw_range_y_min;

    // Map the coordinates based on the normalized position. QPA expects 'area'
    // to be in screen coordinates.
    const int pointCount = m_touchPoints.size();
    for (int i = 0; i < pointCount; ++i) {
        QWindowSystemInterface::TouchPoint &tp(m_touchPoints[i]);

        // Generate a screen position that is always inside the active window
        // or the primary screen.  Even though we report this as a QRectF, internally
        // Qt uses QRect/QPoint so we need to bound the size to winRect.size() - QSize(1, 1)
        const qreal wx = winRect.left() + tp.normalPosition.x() * (winRect.width() - 1);
        const qreal wy = winRect.top() + tp.normalPosition.y() * (winRect.height() - 1);
        const qreal sizeRatio = (winRect.width() + winRect.height()) / qreal(hw_w + hw_h);
        if (tp.area.width() == -1) // touch major was not provided
            tp.area = QRectF(0, 0, 8, 8);
        else
            tp.area = QRectF(0, 0, tp.area.width() * sizeRatio, tp.area.height() * sizeRatio);
        tp.area.moveCenter(QPointF(wx, wy));

        // Calculate normalized pressure.
        if (!hw_pressure_min && !hw_pressure_max)
            tp.pressure = tp.state == QEventPoint::State::Released ? 0 : 1;
        else
            tp.pressure = (tp.pressure - hw_pressure_min) / qreal(hw_pressure_max - hw_pressure_min);

        if (Q_UNLIKELY(qLcEvents().isDebugEnabled()))
            qCDebug(qLcEvents) << "reporting" << tp;
    }

    // Let qguiapp pick the target window.
    if (m_filtered)
        emit q->touchPointsUpdated();
    else
        QWindowSystemInterface::handleTouchEvent(nullptr, q->touchDevice(), m_touchPoints);
}